

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.cpp
# Opt level: O2

entry * libtorrent::dht::anon_unknown_6::save_nodes
                  (entry *__return_storage_ptr__,
                  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                  *nodes)

{
  pointer pbVar1;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *this;
  pointer e;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  string node;
  
  entry::entry(__return_storage_ptr__,list_t);
  this = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
         entry::list(__return_storage_ptr__);
  pbVar1 = (nodes->
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (e = (nodes->
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           )._M_impl.super__Vector_impl_data._M_start; e != pbVar1; e = e + 1) {
    node._M_string_length = 0;
    node.field_2._M_local_buf[0] = '\0';
    out.container = &node;
    node._M_dataplus._M_p = (pointer)&node.field_2;
    aux::
    write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::back_insert_iterator<std::__cxx11::string>&>
              (e,&out);
    ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::__cxx11::string&>(this,&node);
    ::std::__cxx11::string::~string((string *)&node);
  }
  return __return_storage_ptr__;
}

Assistant:

entry save_nodes(std::vector<udp::endpoint> const& nodes)
	{
		entry ret(entry::list_t);
		entry::list_type& list = ret.list();
		for (auto const& ep : nodes)
		{
			std::string node;
			std::back_insert_iterator<std::string> out(node);
			aux::write_endpoint(ep, out);
			list.emplace_back(node);
		}
		return ret;
	}